

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BronKerbosch.cpp
# Opt level: O3

void __thiscall
BronKerbosch::addAlignment
          (BronKerbosch *this,
          unique_ptr<AlignmentRecord,_std::default_delete<AlignmentRecord>_> *alignment_autoptr,
          int *edgecounter,int *nonEdgeCounter,int numGCAllowedPos,int ct)

{
  pointer *pppAVar1;
  size_t *psVar2;
  alignment_id_t id;
  AlignmentRecord *pAVar3;
  unsigned_long uVar4;
  iterator __position;
  vector<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>
  *this_00;
  iterator __position_00;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
  *this_01;
  EdgeCalculator *pEVar5;
  value_type ppVar6;
  pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_> *ppVar7;
  pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_> *ppVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  mapped_type *pmVar12;
  _List_node_base *p_Var13;
  _List_node_base *p_Var14;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
  *p_Var15;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
  *p_Var16;
  _List_node_base *p_Var17;
  vector<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *this_02;
  _Self __tmp;
  _Node_alloc_type *__alloc;
  adjacency_list_t *vertex;
  AlignmentRecord *alignment;
  size_type ind;
  allocator_type local_79;
  pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_> *local_78;
  uint local_70;
  uint local_6c;
  vector<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_> *local_68;
  _Head_base<0UL,_AlignmentRecord_*,_false> local_60;
  list<unsigned_long,_std::allocator<unsigned_long>_> *local_58;
  ulong local_50;
  _List_node_base local_48;
  
  id = (this->super_CliqueFinder).next_id;
  (this->super_CliqueFinder).next_id = id + 1;
  pAVar3 = (alignment_autoptr->_M_t).
           super___uniq_ptr_impl<AlignmentRecord,_std::default_delete<AlignmentRecord>_>._M_t.
           super__Tuple_impl<0UL,_AlignmentRecord_*,_std::default_delete<AlignmentRecord>_>.
           super__Head_base<0UL,_AlignmentRecord_*,_false>._M_head_impl;
  (alignment_autoptr->_M_t).
  super___uniq_ptr_impl<AlignmentRecord,_std::default_delete<AlignmentRecord>_>._M_t.
  super__Tuple_impl<0UL,_AlignmentRecord_*,_std::default_delete<AlignmentRecord>_>.
  super__Head_base<0UL,_AlignmentRecord_*,_false>._M_head_impl = (AlignmentRecord *)0x0;
  local_70 = numGCAllowedPos;
  local_6c = ct;
  local_60._M_head_impl = pAVar3;
  AlignmentRecord::setID(pAVar3,id);
  uVar4 = (this->super_CliqueFinder).alignment_count;
  __position._M_current =
       (this->alignments_).super__Vector_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->super_CliqueFinder).alignment_count = uVar4 + 1;
  this_02 = &this->alignments_;
  if (__position._M_current ==
      (this->alignments_).super__Vector_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<AlignmentRecord*,std::allocator<AlignmentRecord*>>::
    _M_realloc_insert<AlignmentRecord*const&>
              ((vector<AlignmentRecord*,std::allocator<AlignmentRecord*>> *)this_02,__position,
               &local_60._M_head_impl);
  }
  else {
    *__position._M_current = pAVar3;
    pppAVar1 = &(this->alignments_).
                super__Vector_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppAVar1 = *pppAVar1 + 1;
  }
  local_78 = (pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>
              *)operator_new(0x20);
  local_78->first = uVar4;
  (local_78->second).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node
  ._M_size = 0;
  (local_78->second).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)&local_78->second;
  (local_78->second).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)&local_78->second;
  this_00 = (vector<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>
             *)this->vertices_as_lists_;
  __position_00._M_current =
       *(pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_> ***
        )(this_00 + 8);
  if (__position_00._M_current ==
      *(pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_> ***)
       (this_00 + 0x10)) {
    std::
    vector<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>
    ::
    _M_realloc_insert<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*const&>
              (this_00,__position_00,&local_78);
  }
  else {
    *__position_00._M_current = local_78;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
  }
  p_Var17 = (_List_node_base *)this->actives_;
  p_Var14 = p_Var17->_M_next;
  if (p_Var14 != p_Var17) {
    local_68 = this_02;
    do {
      p_Var17 = p_Var14 + 1;
      pAVar3 = (this_02->super__Vector_base<AlignmentRecord_*,_std::allocator<AlignmentRecord_*>_>).
               _M_impl.super__Vector_impl_data._M_start[(long)(p_Var14[1]._M_next)->_M_next];
      uVar9 = AlignmentRecord::getIntervalStart(local_60._M_head_impl);
      uVar10 = AlignmentRecord::getIntervalEnd(pAVar3);
      if (uVar10 < uVar9) {
        local_50 = (((value_type)p_Var17->_M_next)->second).
                   super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
                   _M_size;
        this_01 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
                   *)this->degree_map_;
        p_Var15 = *(_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
                    **)(this_01 + 0x10);
        if (p_Var15 ==
            (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
             *)0x0) {
LAB_0015307e:
          std::__cxx11::
          list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
          ::list((list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                  *)&local_48,1,(value_type *)p_Var17,&local_79);
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
          ::
          _M_emplace_unique<unsigned_long&,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>
                    (this_01,&local_50,
                     (list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                      *)&local_48);
          this_02 = local_68;
          p_Var17 = local_48._M_next;
          while (p_Var17 != &local_48) {
            p_Var13 = (((_List_base<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                         *)&p_Var17->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
            operator_delete(p_Var17);
            p_Var17 = p_Var13;
          }
        }
        else {
          p_Var16 = this_01 + 8;
          do {
            if (*(ulong *)(p_Var15 + 0x20) >= local_50) {
              p_Var16 = p_Var15;
            }
            p_Var15 = *(_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
                        **)(p_Var15 + (ulong)(*(ulong *)(p_Var15 + 0x20) < local_50) * 8 + 0x10);
          } while (p_Var15 !=
                   (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::list<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*,std::allocator<std::pair<unsigned_long,std::__cxx11::list<unsigned_long,std::allocator<unsigned_long>>>*>>>>>
                    *)0x0);
          if ((p_Var16 == this_01 + 8) || (local_50 < *(ulong *)(p_Var16 + 0x20)))
          goto LAB_0015307e;
          pmVar12 = std::
                    map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
                    ::at((map<unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>_>_>_>
                          *)this_01,&local_50);
          p_Var13 = (_List_node_base *)operator_new(0x18);
          p_Var13[1]._M_next = (_List_node_base *)p_Var17->_M_next;
          std::__detail::_List_node_base::_M_hook(p_Var13);
          psVar2 = &(pmVar12->
                    super__List_base<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                    )._M_impl._M_node._M_size;
          *psVar2 = *psVar2 + 1;
          this_02 = local_68;
        }
        p_Var17 = p_Var14->_M_next;
        psVar2 = &(this->actives_->
                  super__List_base<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                  )._M_impl._M_node._M_size;
        *psVar2 = *psVar2 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var14);
        p_Var14 = p_Var17;
      }
      else {
        pEVar5 = (this->super_CliqueFinder).edge_calculator;
        iVar11 = (*pEVar5->_vptr_EdgeCalculator[2])
                           (pEVar5,local_60._M_head_impl,pAVar3,(ulong)local_70,(ulong)local_6c);
        if ((char)iVar11 == '\0') {
LAB_0015319e:
          p_Var14 = (((_List_base<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*,_std::allocator<std::pair<unsigned_long,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_*>_>
                       *)&p_Var14->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          this_02 = local_68;
        }
        else {
          pEVar5 = (this->super_CliqueFinder).second_edge_calculator;
          if ((pEVar5 == (EdgeCalculator *)0x0) ||
             (iVar11 = (*pEVar5->_vptr_EdgeCalculator[2])
                                 (pEVar5,local_60._M_head_impl,pAVar3,(ulong)local_70,
                                  (ulong)local_6c), this_02 = local_68, (char)iVar11 != '\0')) {
            ppVar7 = local_78;
            local_58 = &local_78->second;
            ppVar6 = (value_type)p_Var17->_M_next;
            p_Var13 = (_List_node_base *)operator_new(0x18);
            p_Var13[1]._M_next = (_List_node_base *)ppVar6->first;
            std::__detail::_List_node_base::_M_hook(p_Var13);
            ppVar8 = local_78;
            psVar2 = &(ppVar7->second).
                      super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      _M_node._M_size;
            *psVar2 = *psVar2 + 1;
            ppVar6 = (value_type)p_Var17->_M_next;
            local_58 = &ppVar6->second;
            p_Var13 = (_List_node_base *)operator_new(0x18);
            p_Var13[1]._M_next = (_List_node_base *)ppVar8->first;
            std::__detail::_List_node_base::_M_hook(p_Var13);
            psVar2 = &(ppVar6->second).
                      super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      _M_node._M_size;
            *psVar2 = *psVar2 + 1;
            if (this->lw != (LogWriter *)0x0) {
              LogWriter::reportEdge
                        (this->lw,(uint)local_78->first,
                         *(uint *)&((value_type)p_Var17->_M_next)->first);
            }
            (this->super_CliqueFinder).converged = false;
            goto LAB_0015319e;
          }
        }
      }
      p_Var17 = (_List_node_base *)this->actives_;
    } while (p_Var14 != p_Var17);
  }
  p_Var14 = (_List_node_base *)operator_new(0x18);
  p_Var14[1]._M_next = (_List_node_base *)local_78;
  std::__detail::_List_node_base::_M_hook(p_Var14);
  p_Var17[1]._M_next = (_List_node_base *)((long)&(p_Var17[1]._M_next)->_M_next + 1);
  return;
}

Assistant:

void BronKerbosch::addAlignment(std::unique_ptr<AlignmentRecord>& alignment_autoptr, int& edgecounter, int &nonEdgeCounter, int numGCAllowedPos, int ct) {
	assert(alignment_autoptr.get() != nullptr);
	assert(cliques!=nullptr);
    assert(initialized);

	alignment_id_t id = next_id++;
	AlignmentRecord* alignment = alignment_autoptr.release();
	alignment->setID(id);

	size_t index = alignment_count++;
	alignments_.push_back(alignment);

    adjacency_list_t* vertex = new adjacency_list_t(index, list<size_t>());

    vertices_as_lists_->push_back(vertex);

    for (auto it = actives_->begin(); it != actives_->end();) {
        AlignmentRecord* alignment2 = alignments_[(*it)->first];

        if (alignment->getIntervalStart() > alignment2->getIntervalEnd()) {
            list<adjacency_list_t*>::size_type ind = (*it)->second.size();

            if(degree_map_->count(ind) == 0) {           
                degree_map_->emplace(ind, list<adjacency_list_t*>(1, *it) );
//		degree_map_->insert(std::pair<std::list<adjacency_list_t*>::size_type, std::list<adjacency_list_t*>> (ind, list<adjacency_list_t*>(1, *it)));
            } else {
                degree_map_->at(ind).push_back(*it);
            }
            
            it = actives_->erase(it);
            continue;
        }

        if(edge_calculator.edgeBetween(*alignment, *alignment2,numGCAllowedPos,ct) ) {

            if(second_edge_calculator != nullptr) {
                if(not second_edge_calculator->edgeBetween(*alignment, *alignment2,numGCAllowedPos,ct) ) {
                    continue;
                }
            }

            // Draw edge between current alignment and old alignment in vert
            get<1>(*vertex).push_back((*it)->first);
            get<1>(**it).push_back(vertex->first);

            if (lw != nullptr) lw->reportEdge(vertex->first, (*it)->first);

            converged = false;
        }
        it++;
    }

    actives_->push_back(vertex);

}